

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fASTCDecompressionCases.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::ASTCBlockSizeRemainderCase2D::iterate(ASTCBlockSizeRemainderCase2D *this)

{
  ostringstream *poVar1;
  TextureFormat log;
  undefined8 uVar2;
  ASTCRenderer2D *this_00;
  ulong uVar3;
  int blockHeight;
  int width;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  long *plVar8;
  undefined8 *puVar9;
  int iVar10;
  uint uVar11;
  size_type *psVar12;
  long *plVar13;
  ulong *puVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  int blockWidth;
  IterateResult IVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  ScopedLogSection section;
  RGBA threshold;
  Surface referenceFrame;
  Surface renderedFrame;
  CompressedTexture compressed;
  Texture2D texture;
  ScopedLogSection local_388;
  int local_37c;
  int local_378;
  RGBA local_374;
  string local_370;
  ulong local_350;
  ulong local_348;
  ulong *local_340;
  long local_338;
  ulong local_330;
  long lStack_328;
  string local_320;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0 [2];
  RenderContext *local_2e0;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  Surface local_2b8;
  Surface local_2a0;
  long *local_288 [2];
  long local_278 [2];
  long *local_268 [2];
  long local_258 [2];
  CompressedTexture local_248;
  undefined1 local_220 [112];
  ios_base local_1b0 [8];
  ios_base local_1a8 [264];
  Texture2D local_a0;
  long lVar7;
  
  log = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  uVar2 = *(undefined8 *)
           (((this->m_renderer).
             super_UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
             .m_data.ptr)->m_blockSize).m_data;
  blockWidth = (int)uVar2;
  uVar19 = (long)this->m_currentIteration / (long)blockWidth;
  uVar3 = (long)this->m_currentIteration % (long)blockWidth;
  local_348 = uVar3 & 0xffffffff;
  local_350 = uVar19 & 0xffffffff;
  local_378 = (int)uVar3 + blockWidth * 4;
  iVar10 = local_378 / blockWidth;
  iVar16 = local_378 % blockWidth;
  blockHeight = (int)((ulong)uVar2 >> 0x20);
  local_37c = (int)uVar19 + blockHeight * 4;
  iVar23 = local_37c / blockHeight;
  iVar17 = local_37c % blockHeight;
  local_2e0 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar5 = (*local_2e0->_vptr_RenderContext[4])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  bVar15 = 8 - *(char *)(lVar7 + 8);
  uVar21 = 0;
  if (0 < *(int *)(lVar7 + 0x14)) {
    uVar21 = 0x1000000 << (8U - (char)*(int *)(lVar7 + 0x14) & 0x1f);
  }
  uVar22 = 0x100 << (8U - *(char *)(lVar7 + 0xc) & 0x1f) | 1 << (bVar15 & 0x1f);
  uVar21 = 0x10000 << (8U - *(char *)(lVar7 + 0x10) & 0x1f) | uVar22 | uVar21;
  bVar4 = tcu::isAstcSRGBFormat(this->m_format);
  width = local_378;
  iVar5 = local_37c;
  uVar6 = 0x1010101;
  if (bVar4) {
    uVar6 = 0x2020202;
  }
  uVar11 = (uVar6 & 0xff) + (1 << (bVar15 & 0x1f) & 0xffU);
  if (0xfe < uVar11) {
    uVar11 = 0xff;
  }
  uVar22 = (uVar6 >> 8 & 0xff) + (uVar22 >> 8 & 0xff);
  if (0xfe < uVar22) {
    uVar22 = 0xff;
  }
  uVar20 = (uVar6 >> 0x10 & 0xff) + (uVar21 >> 0x10 & 0xff);
  if (0xfe < uVar20) {
    uVar20 = 0xff;
  }
  uVar21 = (uVar6 >> 0x18) + (uVar21 >> 0x18);
  if (0xfe < uVar21) {
    uVar21 = 0xff;
  }
  local_374.m_value = uVar20 << 0x10 | uVar22 << 8 | uVar11 | uVar21 << 0x18;
  tcu::CompressedTexture::CompressedTexture(&local_248,this->m_format,local_378,local_37c,1);
  tcu::astc::generateDummyNormalBlocks
            (local_248.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (long)(int)(((iVar23 + 1) - (uint)(iVar17 == 0)) * ((iVar10 + 1) - (uint)(iVar16 == 0))
                        ),blockWidth,blockHeight);
  bVar4 = true;
  if (((this->m_renderer).
       super_UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
       .m_data.ptr)->m_astcSupport != ASTCSUPPORTLEVEL_LDR) {
    bVar4 = tcu::isAstcSRGBFormat(this->m_format);
  }
  tcu::Surface::Surface(&local_2a0,width,iVar5);
  tcu::Surface::Surface(&local_2b8,width,iVar5);
  local_220._1_3_ = 0;
  local_220[0] = bVar4 ^ 1;
  glu::Texture2D::Texture2D
            (&local_a0,local_2e0,((this->super_TestCase).m_context)->m_contextInfo,1,&local_248,
             (TexDecompressionParams *)local_220);
  this_00 = (this->m_renderer).
            super_UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
            .m_data.ptr;
  local_220._0_8_ = tcu::getUncompressedFormat(local_248.m_format);
  ASTCDecompressionCaseInternal::ASTCRenderer2D::render
            (this_00,&local_2b8,&local_2a0,&local_a0,(TextureFormat *)local_220);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
  std::ostream::operator<<(local_220,this->m_currentIteration);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
  std::ios_base::~ios_base(local_1b0);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_268,0,(char *)0x0,0x1ca13c7);
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_320.field_2._M_allocated_capacity = *psVar12;
    local_320.field_2._8_8_ = plVar8[3];
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar12;
    local_320._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_320._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
  std::ostream::operator<<(local_220,(int)local_348);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
  std::ios_base::~ios_base(local_1b0);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_288,0,(char *)0x0,0x1c3f2c3);
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_2c8 = *plVar13;
    lStack_2c0 = plVar8[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *plVar13;
    local_2d8 = (long *)*plVar8;
  }
  local_2d0 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  puVar14 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar14) {
    local_330 = *puVar14;
    lStack_328 = plVar8[3];
    local_340 = &local_330;
  }
  else {
    local_330 = *puVar14;
    local_340 = (ulong *)*plVar8;
  }
  local_338 = plVar8[1];
  *plVar8 = (long)puVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
  std::ostream::operator<<(local_220,(int)local_350);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
  std::ios_base::~ios_base(local_1b0);
  uVar19 = 0xf;
  if (local_340 != &local_330) {
    uVar19 = local_330;
  }
  if (uVar19 < (ulong)(local_2f8 + local_338)) {
    uVar19 = 0xf;
    if (local_300 != local_2f0) {
      uVar19 = local_2f0[0];
    }
    if (uVar19 < (ulong)(local_2f8 + local_338)) goto LAB_011889dc;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,(ulong)local_340);
  }
  else {
LAB_011889dc:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_300);
  }
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  psVar12 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_370.field_2._M_allocated_capacity = *psVar12;
    local_370.field_2._8_8_ = puVar9[3];
  }
  else {
    local_370.field_2._M_allocated_capacity = *psVar12;
    local_370._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_370._M_string_length = puVar9[1];
  *puVar9 = psVar12;
  puVar9[1] = 0;
  *(undefined1 *)psVar12 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_388,(TestLog *)log,&local_320,&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300,local_2f0[0] + 1);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340,local_330 + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if (local_268[0] != local_258) {
    operator_delete(local_268[0],local_258[0] + 1);
  }
  poVar1 = (ostringstream *)(local_220 + 8);
  local_220._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Using texture of size ",0x16);
  std::ostream::operator<<(poVar1,width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x",1);
  std::ostream::operator<<(poVar1,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," and block size ",0x10);
  std::ostream::operator<<(poVar1,blockWidth);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x",1);
  std::ostream::operator<<(poVar1,blockHeight);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"; the x and y remainders are ",0x1d);
  std::ostream::operator<<(poVar1,(int)local_348);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," and ",5);
  std::ostream::operator<<(poVar1,(int)local_350);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," respectively",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_220,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_1a8);
  bVar4 = tcu::pixelThresholdCompare
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                     "ComparisonResult","Comparison Result",&local_2b8,&local_2a0,&local_374,
                     COMPARE_LOG_ON_ERROR - (this->m_currentIteration == 0));
  if (bVar4) {
    tcu::TestLog::endSection(local_388.m_log);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
    tcu::TestLog::endSection(local_388.m_log);
    IVar18 = STOP;
    if (!bVar4) goto LAB_01188d69;
  }
  if ((1 < blockHeight * blockWidth) && (this->m_currentIteration == 0)) {
    poVar1 = (ostringstream *)(local_220 + 8);
    local_220._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Note: not logging further images unless reference comparison fails",0x42);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_220,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_1a8);
  }
  iVar5 = this->m_currentIteration + 1;
  this->m_currentIteration = iVar5;
  IVar18 = CONTINUE;
  if (blockHeight * blockWidth <= iVar5) {
    IVar18 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
LAB_01188d69:
  glu::Texture2D::~Texture2D(&local_a0);
  tcu::Surface::~Surface(&local_2b8);
  tcu::Surface::~Surface(&local_2a0);
  tcu::CompressedTexture::~CompressedTexture(&local_248);
  return IVar18;
}

Assistant:

ASTCBlockSizeRemainderCase2D::IterateResult ASTCBlockSizeRemainderCase2D::iterate (void)
{
	TestLog&						log						= m_testCtx.getLog();
	const IVec2						blockSize				= m_renderer->getBlockSize();
	const int						curRemainderX			= m_currentIteration % blockSize.x();
	const int						curRemainderY			= m_currentIteration / blockSize.x();
	const int						imageWidth				= (MAX_NUM_BLOCKS_X-1)*blockSize.x() + curRemainderX;
	const int						imageHeight				= (MAX_NUM_BLOCKS_Y-1)*blockSize.y() + curRemainderY;
	const int						numBlocksX				= deDivRoundUp32(imageWidth, blockSize.x());
	const int						numBlocksY				= deDivRoundUp32(imageHeight, blockSize.y());
	const int						totalNumBlocks			= numBlocksX * numBlocksY;
	const glu::RenderContext&		renderCtx				= m_context.getRenderContext();
	const tcu::RGBA					threshold				= renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + (tcu::isAstcSRGBFormat(m_format) ? tcu::RGBA(2,2,2,2) : tcu::RGBA(1,1,1,1));
	tcu::CompressedTexture			compressed				(m_format, imageWidth, imageHeight);

	DE_ASSERT(compressed.getDataSize() == totalNumBlocks*tcu::astc::BLOCK_SIZE_BYTES);
	tcu::astc::generateDummyNormalBlocks((deUint8*)compressed.getData(), totalNumBlocks, blockSize.x(), blockSize.y());

	// Create texture and render.

	const tcu::TexDecompressionParams::AstcMode	decompressionMode	= (m_renderer->getASTCSupport() == ASTCSUPPORTLEVEL_LDR || tcu::isAstcSRGBFormat(m_format))
																	? tcu::TexDecompressionParams::ASTCMODE_LDR
																	: tcu::TexDecompressionParams::ASTCMODE_HDR;
	Surface										renderedFrame		(imageWidth, imageHeight);
	Surface										referenceFrame		(imageWidth, imageHeight);
	glu::Texture2D								texture				(renderCtx, m_context.getContextInfo(), 1, &compressed, tcu::TexDecompressionParams(decompressionMode));

	m_renderer->render(referenceFrame, renderedFrame, texture, getUncompressedFormat(compressed.getFormat()));

	{
		// Compare and log.

		tcu::ScopedLogSection section(log, "Iteration " + de::toString(m_currentIteration),
										   "Remainder " + de::toString(curRemainderX) + "x" + de::toString(curRemainderY));

		log << TestLog::Message << "Using texture of size "
								<< imageWidth << "x" << imageHeight
								<< " and block size "
								<< blockSize.x() << "x" << blockSize.y()
								<< "; the x and y remainders are "
								<< curRemainderX << " and " << curRemainderY << " respectively"
			<< TestLog::EndMessage;

		const bool compareOk = tcu::pixelThresholdCompare(m_testCtx.getLog(), "ComparisonResult", "Comparison Result", referenceFrame, renderedFrame, threshold,
														  m_currentIteration == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

		if (!compareOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
			return STOP;
		}
	}

	if (m_currentIteration == 0 && m_currentIteration+1 < blockSize.x()*blockSize.y())
		log << TestLog::Message << "Note: not logging further images unless reference comparison fails" << TestLog::EndMessage;

	m_currentIteration++;

	if (m_currentIteration >= blockSize.x()*blockSize.y())
	{
		DE_ASSERT(m_currentIteration == blockSize.x()*blockSize.y());
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}
	return CONTINUE;
}